

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O3

fdb_status fdb_del(fdb_kvs_handle *handle,fdb_doc *doc)

{
  atomic<unsigned_long> *paVar1;
  fdb_status fVar2;
  long lVar3;
  fdb_doc *pfVar4;
  fdb_doc _doc;
  
  if (handle == (fdb_kvs_handle *)0x0) {
    fVar2 = FDB_RESULT_INVALID_HANDLE;
  }
  else {
    fVar2 = FDB_RESULT_INVALID_ARGS;
    if (doc != (fdb_doc *)0x0) {
      if (((handle->config).flags & 2) != 0) {
        fVar2 = fdb_log_impl(&handle->log_callback,3,FDB_RESULT_RONLY_VIOLATION,
                             "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/forestdb.cc"
                             ,"fdb_del",0x1134,
                             "Warning: DEL is not allowed on the read-only DB file \'%s\'.",
                             handle->file->filename);
        return fVar2;
      }
      if (((doc->key != (void *)0x0) && (0xffffffffffff007f < doc->keylen - 0xff81)) &&
         (((handle->kvs_config).custom_cmp == (fdb_custom_cmp_variable)0x0 ||
          (doc->keylen <= (ulong)((handle->config).blocksize - 0x100))))) {
        doc->deleted = true;
        pfVar4 = &_doc;
        for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
          pfVar4->keylen = doc->keylen;
          doc = (fdb_doc *)&doc->metalen;
          pfVar4 = (fdb_doc *)&pfVar4->metalen;
        }
        _doc.bodylen = 0;
        _doc.body = (void *)0x0;
        LOCK();
        paVar1 = &handle->op_stats->num_dels;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
        UNLOCK();
        fVar2 = fdb_set(handle,&_doc);
      }
    }
  }
  return fVar2;
}

Assistant:

LIBFDB_API
fdb_status fdb_del(fdb_kvs_handle *handle, fdb_doc *doc)
{
    if (!handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (!doc) {
        return FDB_RESULT_INVALID_ARGS;
    }

    if (handle->config.flags & FDB_OPEN_FLAG_RDONLY) {
        return fdb_log(&handle->log_callback, FDB_LOG_WARNING,
                       FDB_RESULT_RONLY_VIOLATION,
                       "Warning: DEL is not allowed on the read-only DB file '%s'.",
                       handle->file->filename);
    }

    if (doc->key == NULL || doc->keylen == 0 ||
        doc->keylen > FDB_MAX_KEYLEN ||
        (handle->kvs_config.custom_cmp &&
            doc->keylen > handle->config.blocksize - HBTRIE_HEADROOM)) {
        return FDB_RESULT_INVALID_ARGS;
    }

    doc->deleted = true;
    fdb_doc _doc;
    _doc = *doc;
    _doc.bodylen = 0;
    _doc.body = NULL;

    atomic_incr_uint64_t(&handle->op_stats->num_dels, std::memory_order_relaxed);

    return fdb_set(handle, &_doc);
}